

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::text_format_unittest::TextFormatTest_CompactRepeatedFieldPrinter_Test::TestBody
          (TextFormatTest_CompactRepeatedFieldPrinter_Test *this)

{
  RepeatedPtrField<proto2_unittest::TestAllTypes_NestedMessage> *this_00;
  bool bVar1;
  Descriptor *this_01;
  FieldDescriptor *field;
  FastFieldValuePrinter *printer_00;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>_>
  *pVVar2;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  char *message_00;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_420;
  AssertionResult gtest_ar__1;
  AssertHelper local_408;
  AssertionResult gtest_ar;
  string text;
  Printer printer;
  TestAllTypes message;
  
  TextFormat::Printer::Printer(&printer);
  this_01 = proto2_unittest::TestAllTypes::GetDescriptor();
  field = Descriptor::FindFieldByNumber(this_01,0x30);
  printer_00 = (FastFieldValuePrinter *)operator_new(8);
  CompactRepeatedFieldPrinter::CompactRepeatedFieldPrinter
            ((CompactRepeatedFieldPrinter *)printer_00);
  bVar1 = TextFormat::Printer::RegisterFieldValuePrinter(&printer,field,printer_00);
  text._M_dataplus._M_p._0_1_ = bVar1;
  text._M_string_length = 0;
  if (bVar1) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&text._M_string_length);
    proto2_unittest::TestAllTypes::TestAllTypes(&message);
    this_00 = &message.field_0._impl_.repeated_nested_message_;
    pVVar2 = internal::RepeatedPtrFieldBase::
             Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
                       (&this_00->super_RepeatedPtrFieldBase);
    (pVVar2->field_0)._impl_.bb_ = 1;
    *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
    pVVar2 = internal::RepeatedPtrFieldBase::
             Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
                       (&this_00->super_RepeatedPtrFieldBase);
    (pVVar2->field_0)._impl_.bb_ = 2;
    *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
    pVVar2 = internal::RepeatedPtrFieldBase::
             Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
                       (&this_00->super_RepeatedPtrFieldBase);
    (pVVar2->field_0)._impl_.bb_ = 3;
    *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
    text._M_dataplus._M_p = (pointer)&text.field_2;
    text._M_string_length = 0;
    text.field_2._M_local_buf[0] = '\0';
    gtest_ar__1.success_ = TextFormat::Printer::PrintToString(&printer,&message.super_Message,&text)
    ;
    this_02 = &gtest_ar__1.message_;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (gtest_ar__1.success_) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(this_02);
      testing::internal::CmpHelperEQ<char[53],std::__cxx11::string>
                ((internal *)&gtest_ar,
                 "\"repeated_nested_message {\\n\" \"  bb: 1\\n\" \"  bb: 2\\n\" \"  bb: 3\\n\" \"}\\n\""
                 ,"text",(char (*) [53])"repeated_nested_message {\n  bb: 1\n  bb: 2\n  bb: 3\n}\n",
                 &text);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          message_00 = anon_var_dwarf_651463 + 5;
        }
        else {
          message_00 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_420,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
                   ,0x382,message_00);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_420,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_420);
        if ((long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) + 8))();
        }
      }
      this_02 = &gtest_ar.message_;
    }
    else {
      testing::Message::Message((Message *)&local_420);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar__1,
                 (AssertionResult *)"printer.PrintToString(message, &text)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_408,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
                 ,0x37b,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_408,(Message *)&local_420);
      testing::internal::AssertHelper::~AssertHelper(&local_408);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (local_420._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_420._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_02);
    std::__cxx11::string::~string((string *)&text);
    proto2_unittest::TestAllTypes::~TestAllTypes(&message);
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&message,(internal *)&text,
               (AssertionResult *)
               "printer.RegisterFieldValuePrinter( unittest::TestAllTypes::default_instance() .descriptor() ->FindFieldByNumber( unittest::TestAllTypes::kRepeatedNestedMessageFieldNumber), new CompactRepeatedFieldPrinter)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x373,(char *)message.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    std::__cxx11::string::~string((string *)&message);
    if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&text._M_string_length);
  }
  TextFormat::Printer::~Printer(&printer);
  return;
}

Assistant:

TEST_F(TextFormatTest, CompactRepeatedFieldPrinter) {
  TextFormat::Printer printer;
  ASSERT_TRUE(printer.RegisterFieldValuePrinter(
      unittest::TestAllTypes::default_instance()
          .descriptor()
          ->FindFieldByNumber(
              unittest::TestAllTypes::kRepeatedNestedMessageFieldNumber),
      new CompactRepeatedFieldPrinter));

  proto2_unittest::TestAllTypes message;
  message.add_repeated_nested_message()->set_bb(1);
  message.add_repeated_nested_message()->set_bb(2);
  message.add_repeated_nested_message()->set_bb(3);

  std::string text;
  ASSERT_TRUE(printer.PrintToString(message, &text));
  EXPECT_EQ(
      "repeated_nested_message {\n"
      "  bb: 1\n"
      "  bb: 2\n"
      "  bb: 3\n"
      "}\n",
      text);
}